

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountFailureRepr.cpp
# Opt level: O1

void __thiscall
CountFailureRepr::CountFailureRepr
          (CountFailureRepr *this,shared_ptr<const_oout::CountFailure> *count)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Text)._vptr_Text = (_func_int **)&PTR__CountFailureRepr_00197c90;
  (this->count).super___shared_ptr<const_oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (count->super___shared_ptr<const_oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (count->super___shared_ptr<const_oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->count).super___shared_ptr<const_oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

CountFailureRepr::CountFailureRepr(const shared_ptr<const CountFailure> &count)
	: count(count)
{
}